

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::equals(Forth *this)

{
  uint uVar1;
  uint uVar2;
  uint local_2c;
  uint n2;
  Forth *this_local;
  
  requireDStackDepth(this,2,"=");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (uVar2 == uVar1) {
    local_2c = this->True;
  }
  else {
    local_2c = this->False;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,local_2c);
  return;
}

Assistant:

void equals() {
			REQUIRE_DSTACK_DEPTH(2, "=");
			auto n2 = dStack.getTop(); pop();
			dStack.setTop(dStack.getTop() == n2 ? True : False);
		}